

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extreme_value_dist.hpp
# Opt level: O1

result_type_conflict2 __thiscall
trng::extreme_value_dist<double>::icdf(extreme_value_dist<double> *this,result_type_conflict2 x)

{
  double dVar1;
  double dVar2;
  int *piVar3;
  result_type_conflict2 rVar4;
  double dVar5;
  
  if ((x <= 0.0) || (1.0 <= x)) {
    piVar3 = __errno_location();
    *piVar3 = 0x21;
    rVar4 = NAN;
  }
  else if ((x != 0.0) || (NAN(x))) {
    if ((x != 1.0) || (NAN(x))) {
      dVar1 = (this->P).theta_;
      dVar2 = (this->P).eta_;
      dVar5 = log(1.0 - x);
      dVar5 = log(-dVar5);
      rVar4 = dVar5 * dVar1 + dVar2;
    }
    else {
      rVar4 = INFINITY;
    }
  }
  else {
    rVar4 = -INFINITY;
  }
  return rVar4;
}

Assistant:

icdf(result_type x) const {
      if (x <= 0 or x >= 1) {
#if !(defined TRNG_CUDA)
        errno = EDOM;
#endif
        return math::numeric_limits<result_type>::quiet_NaN();
      }
      if (x == 0)
        return -math::numeric_limits<result_type>::infinity();
      if (x == 1)
        return math::numeric_limits<result_type>::infinity();
      return P.eta() + P.theta() * math::ln(-math::ln(1 - x));
    }